

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_listener_get_tls(nng_listener id,nng_tls_config **cfgp)

{
  nni_listener *local_28;
  nni_listener *l;
  nng_tls_config **ppnStack_18;
  int rv;
  nng_tls_config **cfgp_local;
  nng_listener id_local;
  
  ppnStack_18 = cfgp;
  cfgp_local._0_4_ = id.id;
  l._4_4_ = nni_listener_find(&local_28,id.id);
  cfgp_local._4_4_ = l._4_4_;
  if (l._4_4_ == 0) {
    l._4_4_ = nni_listener_get_tls(local_28,ppnStack_18);
    nni_listener_rele(local_28);
    cfgp_local._4_4_ = l._4_4_;
  }
  return cfgp_local._4_4_;
}

Assistant:

int
nng_listener_get_tls(nng_listener id, nng_tls_config **cfgp)
{
	int           rv;
	nni_listener *l;
	if ((rv = nni_listener_find(&l, id.id)) != 0) {
		return (rv);
	}
	rv = nni_listener_get_tls(l, cfgp);
	nni_listener_rele(l);
	return (rv);
}